

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
xemmai::t_parser::f_expressions
          (t_parser *this,size_t a_indent,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  bool bVar1;
  t_token tVar2;
  t_script *local_30;
  
  if ((this->v_lexer).v_token != c_token__ASTERISK) {
    do {
      f_expression((t_parser *)&stack0xffffffffffffffd0);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)a_nodes,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &stack0xffffffffffffffd0);
      if (local_30 != (t_script *)0x0) {
        (*(local_30->super_t_body)._vptr_t_body[1])();
      }
      tVar2 = (this->v_lexer).v_token;
      bVar1 = (this->v_lexer).v_newline;
      if (tVar2 == c_token__COMMA) {
        if ((bVar1 != false) &&
           ((ulong)((long)(this->v_lexer).v_indent.v_i +
                    (-0x50 - (long)(this->v_lexer).v_indent.v_p) >> 2) < a_indent)) {
          return false;
        }
        t_lexer::f_next(&this->v_lexer);
        tVar2 = (this->v_lexer).v_token;
      }
      else {
        if (bVar1 == false) {
          return false;
        }
        if ((ulong)((long)(this->v_lexer).v_indent.v_i +
                    (-0x50 - (long)(this->v_lexer).v_indent.v_p) >> 2) <= a_indent) {
          return false;
        }
      }
    } while (tVar2 != c_token__ASTERISK);
  }
  t_lexer::f_next(&this->v_lexer);
  f_expression((t_parser *)&stack0xffffffffffffffd0);
  std::
  vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
  ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
            ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
              *)a_nodes,
             (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             &stack0xffffffffffffffd0);
  if (local_30 != (t_script *)0x0) {
    (*(local_30->super_t_body)._vptr_t_body[1])();
  }
  return true;
}

Assistant:

bool t_parser::f_expressions(size_t a_indent, std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	while (v_lexer.f_token() != t_lexer::c_token__ASTERISK) {
		a_nodes.push_back(f_expression());
		if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
			if (v_lexer.f_newline() && v_lexer.f_indent() < a_indent) return false;
			v_lexer.f_next();
			continue;
		}
		if (!v_lexer.f_newline() || v_lexer.f_indent() <= a_indent) return false;
	}
	v_lexer.f_next();
	a_nodes.push_back(f_expression());
	return true;
}